

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::SubGridMBIntersector1Pluecker<8,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  ushort uVar12;
  Geometry *pGVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  AABBNodeMB4D *node1;
  ulong uVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  uint uVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  ulong *puVar51;
  long lVar52;
  ulong uVar53;
  long lVar54;
  float fVar55;
  float fVar87;
  float fVar88;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined4 uVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  float fVar118;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  UVIdentity<8> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_15d9;
  RTCRayQueryContext *local_15d8;
  Geometry *local_15d0;
  RTCIntersectArguments *local_15c8;
  Ray *local_15c0;
  ulong local_15b8;
  ulong local_15b0;
  uint local_15a4;
  uint local_15a0;
  int local_159c;
  RayQueryContext *local_1598;
  ulong *local_1590;
  ulong local_1588;
  undefined1 local_1580 [16];
  long local_1568;
  long local_1560;
  long local_1558;
  ulong local_1550;
  long local_1548;
  long local_1540;
  ulong local_1538;
  long local_1530;
  long local_1528;
  Scene *local_1520;
  long local_1518;
  long local_1510;
  long local_1508;
  float local_1500;
  float local_14fc;
  float local_14f8;
  undefined4 local_14f4;
  undefined4 local_14f0;
  undefined4 local_14ec;
  undefined4 local_14e8;
  uint local_14e4;
  uint local_14e0;
  RTCFilterFunctionNArguments local_14d0;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 *local_12e0;
  byte local_12d8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  uint uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  uint uStack_1204;
  ulong local_1200 [570];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
    auVar61 = vucomiss_avx512f(ZEXT416((uint)ray->tfar));
    auVar125 = ZEXT1664(auVar61);
    if (local_1200[0] < 9) {
      puVar51 = local_1200 + 1;
      aVar1 = (ray->dir).field_0;
      auVar56 = vmaxss_avx512f(auVar61,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar57._8_4_ = 0x7fffffff;
      auVar57._0_8_ = 0x7fffffff7fffffff;
      auVar57._12_4_ = 0x7fffffff;
      auVar57 = vandps_avx512vl((undefined1  [16])aVar1,auVar57);
      auVar58._8_4_ = 0x219392ef;
      auVar58._0_8_ = 0x219392ef219392ef;
      auVar58._12_4_ = 0x219392ef;
      uVar45 = vcmpps_avx512vl(auVar57,auVar58,1);
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = 0x3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar57 = vdivps_avx(auVar102,(undefined1  [16])aVar1);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar16 = (bool)((byte)uVar45 & 1);
      auVar60._0_4_ = (uint)bVar16 * auVar58._0_4_ | (uint)!bVar16 * auVar57._0_4_;
      bVar16 = (bool)((byte)(uVar45 >> 1) & 1);
      auVar60._4_4_ = (uint)bVar16 * auVar58._4_4_ | (uint)!bVar16 * auVar57._4_4_;
      bVar16 = (bool)((byte)(uVar45 >> 2) & 1);
      auVar60._8_4_ = (uint)bVar16 * auVar58._8_4_ | (uint)!bVar16 * auVar57._8_4_;
      bVar16 = (bool)((byte)(uVar45 >> 3) & 1);
      auVar60._12_4_ = (uint)bVar16 * auVar58._12_4_ | (uint)!bVar16 * auVar57._12_4_;
      auVar59._8_4_ = 0x3f7ffffa;
      auVar59._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar59._12_4_ = 0x3f7ffffa;
      vmulps_avx512vl(auVar60,auVar59);
      auVar26._8_4_ = 0x3f800003;
      auVar26._0_8_ = 0x3f8000033f800003;
      auVar26._12_4_ = 0x3f800003;
      auVar59 = vmulps_avx512vl(auVar60,auVar26);
      auVar62 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar126 = ZEXT3264(auVar62);
      auVar62 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar127 = ZEXT3264(auVar62);
      auVar62 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar128 = ZEXT3264(auVar62);
      auVar58 = vucomiss_avx512f(auVar61);
      auVar62 = vbroadcastss_avx512vl(auVar58);
      auVar129 = ZEXT3264(auVar62);
      auVar57 = vmovshdup_avx(auVar58);
      auVar62 = vbroadcastsd_avx512vl(auVar57);
      auVar130 = ZEXT3264(auVar62);
      vshufpd_avx(auVar58,auVar58,1);
      auVar63._8_4_ = 2;
      auVar63._0_8_ = 0x200000002;
      auVar63._12_4_ = 2;
      auVar63._16_4_ = 2;
      auVar63._20_4_ = 2;
      auVar63._24_4_ = 2;
      auVar63._28_4_ = 2;
      local_1360 = vpermps_avx2(auVar63,ZEXT1632(auVar58));
      auVar115 = ZEXT3264(local_1360);
      fVar91 = auVar59._0_4_;
      auVar62._8_4_ = 1;
      auVar62._0_8_ = 0x100000001;
      auVar62._12_4_ = 1;
      auVar62._16_4_ = 1;
      auVar62._20_4_ = 1;
      auVar62._24_4_ = 1;
      auVar62._28_4_ = 1;
      local_13a0 = vpermps_avx2(auVar62,ZEXT1632(auVar59));
      auVar119 = ZEXT3264(local_13a0);
      local_13c0 = vpermps_avx2(auVar63,ZEXT1632(auVar59));
      auVar121 = ZEXT3264(local_13c0);
      lVar52 = 0;
      vucomiss_avx512f(auVar61);
      lVar54 = 0x40;
      vucomiss_avx512f(auVar61);
      uVar98 = auVar56._0_4_;
      local_13e0._4_4_ = uVar98;
      local_13e0._0_4_ = uVar98;
      local_13e0._8_4_ = uVar98;
      local_13e0._12_4_ = uVar98;
      local_13e0._16_4_ = uVar98;
      local_13e0._20_4_ = uVar98;
      local_13e0._24_4_ = uVar98;
      local_13e0._28_4_ = uVar98;
      auVar123 = ZEXT3264(local_13e0);
      local_1400 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar124 = ZEXT3264(local_1400);
      local_1598 = context;
      local_1558 = 0;
      local_1380 = fVar91;
      fStack_137c = fVar91;
      fStack_1378 = fVar91;
      fStack_1374 = fVar91;
      fStack_1370 = fVar91;
      fStack_136c = fVar91;
      fStack_1368 = fVar91;
      fStack_1364 = fVar91;
      local_1560 = 0x40;
      fVar118 = fVar91;
      fVar55 = fVar91;
      fVar87 = fVar91;
      fVar88 = fVar91;
      fVar89 = fVar91;
      fVar90 = fVar91;
      local_15c0 = ray;
LAB_01c84046:
      if (puVar51 != local_1200) {
        uVar45 = puVar51[-1];
        puVar51 = puVar51 + -1;
LAB_01c84057:
        uVar98 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
        auVar84._4_4_ = uVar98;
        auVar84._0_4_ = uVar98;
        auVar84._8_4_ = uVar98;
        auVar84._12_4_ = uVar98;
        auVar84._16_4_ = uVar98;
        auVar84._20_4_ = uVar98;
        auVar84._24_4_ = uVar98;
        auVar84._28_4_ = uVar98;
        while ((uVar45 & 8) == 0) {
          uVar42 = uVar45 & 0xfffffffffffffff0;
          auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x100 + lVar52),auVar84,
                                    *(undefined1 (*) [32])(uVar42 + 0x40 + lVar52));
          auVar62 = vsubps_avx512vl(ZEXT1632(auVar61),auVar126._0_32_);
          auVar63 = vmulps_avx512vl(auVar129._0_32_,auVar62);
          auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x100 + lVar54),auVar84,
                                    *(undefined1 (*) [32])(uVar42 + 0x40 + lVar54));
          auVar62 = vsubps_avx512vl(ZEXT1632(auVar61),auVar127._0_32_);
          auVar62 = vmulps_avx512vl(auVar130._0_32_,auVar62);
          auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x180),auVar84,
                                    *(undefined1 (*) [32])(uVar42 + 0xc0));
          auVar64 = vsubps_avx512vl(ZEXT1632(auVar61),auVar128._0_32_);
          auVar32._4_4_ = auVar115._4_4_ * auVar64._4_4_;
          auVar32._0_4_ = auVar115._0_4_ * auVar64._0_4_;
          auVar32._8_4_ = auVar115._8_4_ * auVar64._8_4_;
          auVar32._12_4_ = auVar115._12_4_ * auVar64._12_4_;
          auVar32._16_4_ = auVar115._16_4_ * auVar64._16_4_;
          auVar32._20_4_ = auVar115._20_4_ * auVar64._20_4_;
          auVar32._24_4_ = auVar115._24_4_ * auVar64._24_4_;
          auVar32._28_4_ = auVar64._28_4_;
          auVar62 = vmaxps_avx(auVar62,auVar32);
          auVar63 = vmaxps_avx(auVar123._0_32_,auVar63);
          auVar62 = vmaxps_avx(auVar63,auVar62);
          auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x120),auVar84,
                                    *(undefined1 (*) [32])(uVar42 + 0x60));
          auVar63 = vsubps_avx512vl(ZEXT1632(auVar61),auVar126._0_32_);
          auVar33._4_4_ = fVar118 * auVar63._4_4_;
          auVar33._0_4_ = fVar91 * auVar63._0_4_;
          auVar33._8_4_ = fVar55 * auVar63._8_4_;
          auVar33._12_4_ = fVar87 * auVar63._12_4_;
          auVar33._16_4_ = fVar88 * auVar63._16_4_;
          auVar33._20_4_ = fVar89 * auVar63._20_4_;
          auVar33._24_4_ = fVar90 * auVar63._24_4_;
          auVar33._28_4_ = auVar63._28_4_;
          auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x160),auVar84,
                                    *(undefined1 (*) [32])(uVar42 + 0xa0));
          auVar63 = vsubps_avx512vl(ZEXT1632(auVar61),auVar127._0_32_);
          auVar34._4_4_ = auVar119._4_4_ * auVar63._4_4_;
          auVar34._0_4_ = auVar119._0_4_ * auVar63._0_4_;
          auVar34._8_4_ = auVar119._8_4_ * auVar63._8_4_;
          auVar34._12_4_ = auVar119._12_4_ * auVar63._12_4_;
          auVar34._16_4_ = auVar119._16_4_ * auVar63._16_4_;
          auVar34._20_4_ = auVar119._20_4_ * auVar63._20_4_;
          auVar34._24_4_ = auVar119._24_4_ * auVar63._24_4_;
          auVar34._28_4_ = auVar63._28_4_;
          auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar42 + 0x1a0),auVar84,
                                    *(undefined1 (*) [32])(uVar42 + 0xe0));
          auVar63 = vsubps_avx512vl(ZEXT1632(auVar61),auVar128._0_32_);
          auVar35._4_4_ = auVar121._4_4_ * auVar63._4_4_;
          auVar35._0_4_ = auVar121._0_4_ * auVar63._0_4_;
          auVar35._8_4_ = auVar121._8_4_ * auVar63._8_4_;
          auVar35._12_4_ = auVar121._12_4_ * auVar63._12_4_;
          auVar35._16_4_ = auVar121._16_4_ * auVar63._16_4_;
          auVar35._20_4_ = auVar121._20_4_ * auVar63._20_4_;
          auVar35._24_4_ = auVar121._24_4_ * auVar63._24_4_;
          auVar35._28_4_ = auVar63._28_4_;
          auVar63 = vminps_avx(auVar34,auVar35);
          auVar64 = vminps_avx512vl(auVar124._0_32_,auVar33);
          auVar63 = vminps_avx(auVar64,auVar63);
          if (((uint)uVar45 & 7) == 6) {
            uVar23 = vcmpps_avx512vl(auVar62,auVar63,2);
            uVar24 = vcmpps_avx512vl(auVar84,*(undefined1 (*) [32])(uVar42 + 0x1c0),0xd);
            uVar25 = vcmpps_avx512vl(auVar84,*(undefined1 (*) [32])(uVar42 + 0x1e0),1);
            uVar46 = (uint)uVar23 & (uint)uVar24 & (uint)uVar25;
          }
          else {
            uVar23 = vcmpps_avx512vl(auVar62,auVar63,2);
            uVar46 = (uint)uVar23;
          }
          if ((byte)uVar46 == 0) goto LAB_01c84046;
          lVar43 = 0;
          for (uVar45 = (ulong)(byte)uVar46; (uVar45 & 1) == 0;
              uVar45 = uVar45 >> 1 | 0x8000000000000000) {
            lVar43 = lVar43 + 1;
          }
          uVar45 = *(ulong *)(uVar42 + lVar43 * 8);
          uVar46 = (uVar46 & 0xff) - 1 & uVar46 & 0xff;
          uVar47 = (ulong)uVar46;
          if (uVar46 != 0) goto LAB_01c84194;
        }
        uVar42 = uVar45 & 0xfffffffffffffff0;
        local_1590 = puVar51;
        local_1568 = (ulong)((uint)uVar45 & 0xf) - 8;
        for (local_1540 = 0; local_1540 != local_1568; local_1540 = local_1540 + 1) {
          lVar43 = local_1540 * 0xe0;
          fVar92 = ((ray->dir).field_0.m128[3] - *(float *)(uVar42 + 0xd0 + lVar43)) *
                   *(float *)(uVar42 + 0xd4 + lVar43);
          auVar96._8_8_ = 0;
          auVar96._0_8_ = *(ulong *)(uVar42 + 0x40 + lVar43);
          auVar99._8_8_ = 0;
          auVar99._0_8_ = *(ulong *)(uVar42 + 0x48 + lVar43);
          uVar23 = vpcmpub_avx512vl(auVar96,auVar99,2);
          auVar62 = vpmovzxbd_avx2(auVar96);
          auVar62 = vcvtdq2ps_avx(auVar62);
          uVar98 = *(undefined4 *)(uVar42 + 0x7c + lVar43);
          auVar69._4_4_ = uVar98;
          auVar69._0_4_ = uVar98;
          auVar69._8_4_ = uVar98;
          auVar69._12_4_ = uVar98;
          auVar69._16_4_ = uVar98;
          auVar69._20_4_ = uVar98;
          auVar69._24_4_ = uVar98;
          auVar69._28_4_ = uVar98;
          uVar98 = *(undefined4 *)(uVar42 + 0x70 + lVar43);
          auVar71._4_4_ = uVar98;
          auVar71._0_4_ = uVar98;
          auVar71._8_4_ = uVar98;
          auVar71._12_4_ = uVar98;
          auVar71._16_4_ = uVar98;
          auVar71._20_4_ = uVar98;
          auVar71._24_4_ = uVar98;
          auVar71._28_4_ = uVar98;
          auVar57 = vfmadd213ps_fma(auVar62,auVar69,auVar71);
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)(uVar42 + 0x88 + lVar43);
          auVar62 = vpmovzxbd_avx2(auVar61);
          uVar98 = *(undefined4 *)(uVar42 + 0xc4 + lVar43);
          auVar74._4_4_ = uVar98;
          auVar74._0_4_ = uVar98;
          auVar74._8_4_ = uVar98;
          auVar74._12_4_ = uVar98;
          auVar74._16_4_ = uVar98;
          auVar74._20_4_ = uVar98;
          auVar74._24_4_ = uVar98;
          auVar74._28_4_ = uVar98;
          uVar98 = *(undefined4 *)(uVar42 + 0xb8 + lVar43);
          auVar75._4_4_ = uVar98;
          auVar75._0_4_ = uVar98;
          auVar75._8_4_ = uVar98;
          auVar75._12_4_ = uVar98;
          auVar75._16_4_ = uVar98;
          auVar75._20_4_ = uVar98;
          auVar75._24_4_ = uVar98;
          auVar75._28_4_ = uVar98;
          auVar62 = vcvtdq2ps_avx(auVar62);
          auVar61 = vfmadd213ps_fma(auVar62,auVar74,auVar75);
          auVar65._4_4_ = fVar92;
          auVar65._0_4_ = fVar92;
          auVar65._8_4_ = fVar92;
          auVar65._12_4_ = fVar92;
          auVar65._16_4_ = fVar92;
          auVar65._20_4_ = fVar92;
          auVar65._24_4_ = fVar92;
          auVar65._28_4_ = fVar92;
          auVar62 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar57));
          auVar61 = vfmadd213ps_fma(auVar62,auVar65,ZEXT1632(auVar57));
          auVar62 = vpmovzxbd_avx2(auVar99);
          auVar62 = vcvtdq2ps_avx(auVar62);
          auVar57 = vfmadd213ps_fma(auVar62,auVar69,auVar71);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)(uVar42 + 0x90 + lVar43);
          auVar62 = vpmovzxbd_avx2(auVar56);
          auVar62 = vcvtdq2ps_avx(auVar62);
          auVar58 = vfmadd213ps_fma(auVar62,auVar74,auVar75);
          auVar62 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar57));
          auVar57 = vfmadd213ps_fma(auVar62,auVar65,ZEXT1632(auVar57));
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(uVar42 + 0x50 + lVar43);
          auVar62 = vpmovzxbd_avx2(auVar3);
          uVar98 = *(undefined4 *)(uVar42 + 0x80 + lVar43);
          auVar70._4_4_ = uVar98;
          auVar70._0_4_ = uVar98;
          auVar70._8_4_ = uVar98;
          auVar70._12_4_ = uVar98;
          auVar70._16_4_ = uVar98;
          auVar70._20_4_ = uVar98;
          auVar70._24_4_ = uVar98;
          auVar70._28_4_ = uVar98;
          auVar62 = vcvtdq2ps_avx(auVar62);
          uVar98 = *(undefined4 *)(uVar42 + 0x74 + lVar43);
          auVar72._4_4_ = uVar98;
          auVar72._0_4_ = uVar98;
          auVar72._8_4_ = uVar98;
          auVar72._12_4_ = uVar98;
          auVar72._16_4_ = uVar98;
          auVar72._20_4_ = uVar98;
          auVar72._24_4_ = uVar98;
          auVar72._28_4_ = uVar98;
          auVar58 = vfmadd213ps_fma(auVar62,auVar70,auVar72);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(uVar42 + 0x98 + lVar43);
          auVar62 = vpmovzxbd_avx2(auVar4);
          auVar62 = vcvtdq2ps_avx(auVar62);
          uVar98 = *(undefined4 *)(uVar42 + 200 + lVar43);
          auVar76._4_4_ = uVar98;
          auVar76._0_4_ = uVar98;
          auVar76._8_4_ = uVar98;
          auVar76._12_4_ = uVar98;
          auVar76._16_4_ = uVar98;
          auVar76._20_4_ = uVar98;
          auVar76._24_4_ = uVar98;
          auVar76._28_4_ = uVar98;
          uVar98 = *(undefined4 *)(uVar42 + 0xbc + lVar43);
          auVar78._4_4_ = uVar98;
          auVar78._0_4_ = uVar98;
          auVar78._8_4_ = uVar98;
          auVar78._12_4_ = uVar98;
          auVar78._16_4_ = uVar98;
          auVar78._20_4_ = uVar98;
          auVar78._24_4_ = uVar98;
          auVar78._28_4_ = uVar98;
          auVar59 = vfmadd213ps_fma(auVar62,auVar76,auVar78);
          auVar62 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar58));
          auVar58 = vfmadd213ps_fma(auVar62,auVar65,ZEXT1632(auVar58));
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(uVar42 + 0x58 + lVar43);
          auVar62 = vpmovzxbd_avx2(auVar5);
          auVar62 = vcvtdq2ps_avx(auVar62);
          auVar59 = vfmadd213ps_fma(auVar62,auVar70,auVar72);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(uVar42 + 0xa0 + lVar43);
          auVar62 = vpmovzxbd_avx2(auVar6);
          auVar62 = vcvtdq2ps_avx(auVar62);
          auVar26 = vfmadd213ps_fma(auVar62,auVar76,auVar78);
          auVar62 = vsubps_avx(ZEXT1632(auVar26),ZEXT1632(auVar59));
          auVar59 = vfmadd213ps_fma(auVar62,auVar65,ZEXT1632(auVar59));
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(uVar42 + 0x60 + lVar43);
          auVar62 = vpmovzxbd_avx2(auVar7);
          uVar98 = *(undefined4 *)(uVar42 + 0x84 + lVar43);
          auVar73._4_4_ = uVar98;
          auVar73._0_4_ = uVar98;
          auVar73._8_4_ = uVar98;
          auVar73._12_4_ = uVar98;
          auVar73._16_4_ = uVar98;
          auVar73._20_4_ = uVar98;
          auVar73._24_4_ = uVar98;
          auVar73._28_4_ = uVar98;
          uVar98 = *(undefined4 *)(uVar42 + 0x78 + lVar43);
          auVar77._4_4_ = uVar98;
          auVar77._0_4_ = uVar98;
          auVar77._8_4_ = uVar98;
          auVar77._12_4_ = uVar98;
          auVar77._16_4_ = uVar98;
          auVar77._20_4_ = uVar98;
          auVar77._24_4_ = uVar98;
          auVar77._28_4_ = uVar98;
          auVar62 = vcvtdq2ps_avx(auVar62);
          auVar26 = vfmadd213ps_fma(auVar62,auVar73,auVar77);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)(uVar42 + 0xa8 + lVar43);
          auVar62 = vpmovzxbd_avx2(auVar8);
          uVar98 = *(undefined4 *)(uVar42 + 0xcc + lVar43);
          auVar79._4_4_ = uVar98;
          auVar79._0_4_ = uVar98;
          auVar79._8_4_ = uVar98;
          auVar79._12_4_ = uVar98;
          auVar79._16_4_ = uVar98;
          auVar79._20_4_ = uVar98;
          auVar79._24_4_ = uVar98;
          auVar79._28_4_ = uVar98;
          auVar62 = vcvtdq2ps_avx(auVar62);
          uVar98 = *(undefined4 *)(uVar42 + 0xc0 + lVar43);
          auVar80._4_4_ = uVar98;
          auVar80._0_4_ = uVar98;
          auVar80._8_4_ = uVar98;
          auVar80._12_4_ = uVar98;
          auVar80._16_4_ = uVar98;
          auVar80._20_4_ = uVar98;
          auVar80._24_4_ = uVar98;
          auVar80._28_4_ = uVar98;
          auVar56 = vfmadd213ps_fma(auVar62,auVar79,auVar80);
          auVar62 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar26));
          auVar26 = vfmadd213ps_fma(auVar62,auVar65,ZEXT1632(auVar26));
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(uVar42 + 0x68 + lVar43);
          auVar62 = vpmovzxbd_avx2(auVar9);
          auVar62 = vcvtdq2ps_avx(auVar62);
          auVar56 = vfmadd213ps_fma(auVar62,auVar73,auVar77);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(uVar42 + 0xb0 + lVar43);
          auVar62 = vpmovzxbd_avx2(auVar10);
          auVar62 = vcvtdq2ps_avx(auVar62);
          auVar60 = vfmadd213ps_fma(auVar62,auVar79,auVar80);
          auVar62 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar56));
          auVar56 = vfmadd213ps_fma(auVar62,auVar65,ZEXT1632(auVar56));
          auVar62 = vsubps_avx512vl(ZEXT1632(auVar61),auVar126._0_32_);
          auVar62 = vmulps_avx512vl(auVar129._0_32_,auVar62);
          auVar63 = vsubps_avx512vl(ZEXT1632(auVar58),auVar127._0_32_);
          auVar65 = vmulps_avx512vl(auVar130._0_32_,auVar63);
          auVar63 = vsubps_avx512vl(ZEXT1632(auVar26),auVar128._0_32_);
          auVar66._4_4_ = auVar115._4_4_ * auVar63._4_4_;
          auVar66._0_4_ = auVar115._0_4_ * auVar63._0_4_;
          auVar66._8_4_ = auVar115._8_4_ * auVar63._8_4_;
          auVar66._12_4_ = auVar115._12_4_ * auVar63._12_4_;
          auVar66._16_4_ = auVar115._16_4_ * auVar63._16_4_;
          auVar66._20_4_ = auVar115._20_4_ * auVar63._20_4_;
          auVar66._24_4_ = auVar115._24_4_ * auVar63._24_4_;
          auVar66._28_4_ = auVar63._28_4_;
          auVar63 = vsubps_avx512vl(ZEXT1632(auVar57),auVar126._0_32_);
          auVar64._4_4_ = fVar118 * auVar63._4_4_;
          auVar64._0_4_ = fVar91 * auVar63._0_4_;
          auVar64._8_4_ = fVar55 * auVar63._8_4_;
          auVar64._12_4_ = fVar87 * auVar63._12_4_;
          auVar64._16_4_ = fVar88 * auVar63._16_4_;
          auVar64._20_4_ = fVar89 * auVar63._20_4_;
          auVar64._24_4_ = fVar90 * auVar63._24_4_;
          auVar64._28_4_ = auVar63._28_4_;
          auVar63 = vsubps_avx512vl(ZEXT1632(auVar59),auVar127._0_32_);
          auVar67._4_4_ = auVar119._4_4_ * auVar63._4_4_;
          auVar67._0_4_ = auVar119._0_4_ * auVar63._0_4_;
          auVar67._8_4_ = auVar119._8_4_ * auVar63._8_4_;
          auVar67._12_4_ = auVar119._12_4_ * auVar63._12_4_;
          auVar67._16_4_ = auVar119._16_4_ * auVar63._16_4_;
          auVar67._20_4_ = auVar119._20_4_ * auVar63._20_4_;
          auVar67._24_4_ = auVar119._24_4_ * auVar63._24_4_;
          auVar67._28_4_ = auVar63._28_4_;
          auVar63 = vsubps_avx512vl(ZEXT1632(auVar56),auVar128._0_32_);
          auVar68._4_4_ = auVar121._4_4_ * auVar63._4_4_;
          auVar68._0_4_ = auVar121._0_4_ * auVar63._0_4_;
          auVar68._8_4_ = auVar121._8_4_ * auVar63._8_4_;
          auVar68._12_4_ = auVar121._12_4_ * auVar63._12_4_;
          auVar68._16_4_ = auVar121._16_4_ * auVar63._16_4_;
          auVar68._20_4_ = auVar121._20_4_ * auVar63._20_4_;
          auVar68._24_4_ = auVar121._24_4_ * auVar63._24_4_;
          auVar68._28_4_ = auVar63._28_4_;
          auVar63 = vpminsd_avx2(auVar62,auVar64);
          auVar62 = vpmaxsd_avx2(auVar62,auVar64);
          auVar84 = vpminsd_avx2(auVar65,auVar67);
          auVar63 = vpmaxsd_avx2(auVar63,auVar84);
          auVar84 = vpmaxsd_avx2(auVar65,auVar67);
          auVar64 = vpminsd_avx2(auVar62,auVar84);
          auVar84 = vpminsd_avx2(auVar66,auVar68);
          auVar62 = vpmaxsd_avx2(auVar66,auVar68);
          auVar84 = vpmaxsd_avx2(auVar84,auVar123._0_32_);
          auVar63 = vpmaxsd_avx2(auVar63,auVar84);
          auVar62 = vpminsd_avx512vl(auVar62,auVar124._0_32_);
          auVar62 = vpminsd_avx2(auVar64,auVar62);
          uVar24 = vpcmpd_avx512vl(auVar63,auVar62,2);
          local_1548 = uVar42 + lVar43;
          uVar45 = CONCAT44((int)((ulong)lVar43 >> 0x20),(uint)(byte)((byte)uVar23 & (byte)uVar24));
          while (uVar45 != 0) {
            local_1538 = uVar45;
            lVar52 = 0;
            for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
              lVar52 = lVar52 + 1;
            }
            uVar11 = *(ushort *)(local_1548 + lVar52 * 8);
            uVar12 = *(ushort *)(local_1548 + 2 + lVar52 * 8);
            local_1588 = (ulong)*(uint *)(local_1548 + 0xd8);
            local_1550 = (ulong)*(uint *)(local_1548 + 4 + lVar52 * 8);
            local_1520 = context->scene;
            pGVar13 = (local_1520->geometries).items[local_1588].ptr;
            local_1528 = *(long *)&pGVar13->field_0x58;
            local_1530 = pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i * local_1550;
            fVar118 = (pGVar13->time_range).lower;
            fVar118 = pGVar13->fnumTimeSegments *
                      (((ray->dir).field_0.m128[3] - fVar118) /
                      ((pGVar13->time_range).upper - fVar118));
            auVar61 = vroundss_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),9);
            auVar57 = vaddss_avx512f(ZEXT416((uint)pGVar13->fnumTimeSegments),
                                     SUB6416(ZEXT464(0xbf800000),0));
            auVar61 = vminss_avx(auVar61,auVar57);
            auVar60 = vmaxss_avx512f(auVar125._0_16_,auVar61);
            local_15a0 = uVar11 & 0x7fff;
            local_15a4 = uVar12 & 0x7fff;
            uVar46 = *(uint *)(local_1528 + 4 + local_1530);
            uVar53 = (ulong)uVar46;
            uVar47 = (ulong)(uVar46 * local_15a4 + *(int *)(local_1528 + local_1530) + local_15a0);
            lVar54 = *(long *)&pGVar13[2].numPrimitives;
            lVar48 = (long)(int)auVar60._0_4_ * 0x38;
            lVar43 = *(long *)(lVar54 + 0x10 + lVar48);
            lVar14 = *(long *)(lVar54 + lVar48);
            auVar61 = *(undefined1 (*) [16])(lVar14 + lVar43 * uVar47);
            lVar15 = *(long *)(lVar54 + 0x48 + lVar48);
            auVar57 = *(undefined1 (*) [16])(lVar14 + (uVar47 + 1) * lVar43);
            lVar52 = uVar47 + uVar53;
            auVar58 = *(undefined1 (*) [16])(lVar14 + lVar52 * lVar43);
            lVar50 = uVar47 + uVar53 + 1;
            auVar59 = *(undefined1 (*) [16])(lVar14 + lVar50 * lVar43);
            local_1580._0_8_ = lVar15 * uVar47;
            local_1508 = lVar15 * lVar52;
            local_1510 = lVar15 * lVar50;
            uVar45 = (ulong)(-1 < (short)uVar11);
            lVar44 = uVar47 + uVar45 + 1;
            auVar26 = *(undefined1 (*) [16])(lVar14 + lVar44 * lVar43);
            lVar49 = uVar45 + lVar50;
            auVar56 = *(undefined1 (*) [16])(lVar14 + lVar49 * lVar43);
            local_1518 = lVar15 * lVar49;
            uVar45 = 0;
            if (-1 < (short)uVar12) {
              uVar45 = uVar53;
            }
            auVar102 = *(undefined1 (*) [16])(lVar14 + (lVar52 + uVar45) * lVar43);
            auVar3 = *(undefined1 (*) [16])(lVar14 + (lVar50 + uVar45) * lVar43);
            auVar4 = *(undefined1 (*) [16])(lVar14 + lVar43 * (uVar45 + lVar49));
            lVar54 = *(long *)(lVar54 + 0x38 + lVar48);
            fVar118 = fVar118 - auVar60._0_4_;
            auVar93._4_4_ = fVar118;
            auVar93._0_4_ = fVar118;
            auVar93._8_4_ = fVar118;
            auVar93._12_4_ = fVar118;
            auVar60 = vsubps_avx(*(undefined1 (*) [16])(lVar54 + lVar15 * uVar47),auVar61);
            auVar5 = vfmadd213ps_fma(auVar60,auVar93,auVar61);
            auVar61 = vsubps_avx(*(undefined1 (*) [16])(lVar54 + lVar15 * (uVar47 + 1)),auVar57);
            auVar6 = vfmadd213ps_fma(auVar61,auVar93,auVar57);
            auVar61 = vsubps_avx(*(undefined1 (*) [16])(lVar54 + lVar15 * lVar52),auVar58);
            auVar7 = vfmadd213ps_fma(auVar61,auVar93,auVar58);
            auVar61 = vsubps_avx(*(undefined1 (*) [16])(lVar54 + lVar15 * lVar50),auVar59);
            auVar8 = vfmadd213ps_fma(auVar61,auVar93,auVar59);
            auVar61 = vsubps_avx(*(undefined1 (*) [16])(lVar54 + lVar15 * lVar44),auVar26);
            auVar57 = vfmadd213ps_fma(auVar61,auVar93,auVar26);
            auVar61 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar54 + lVar15 * lVar49),auVar56);
            auVar9 = vfmadd213ps_fma(auVar61,auVar93,auVar56);
            auVar61 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar54 + lVar15 * (lVar52 + uVar45)),
                                      auVar102);
            auVar102 = vfmadd213ps_fma(auVar61,auVar93,auVar102);
            auVar61 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar54 + lVar15 * (lVar50 + uVar45)),
                                      auVar3);
            auVar3 = vfmadd213ps_fma(auVar61,auVar93,auVar3);
            auVar61 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar54 + (uVar45 + lVar49) * lVar15),
                                      auVar4);
            auVar4 = vfmadd213ps_fma(auVar61,auVar93,auVar4);
            auVar58 = vunpcklps_avx(auVar6,auVar9);
            auVar61 = vunpckhps_avx(auVar6,auVar9);
            auVar59 = vunpcklps_avx(auVar57,auVar8);
            auVar57 = vunpckhps_avx(auVar57,auVar8);
            auVar26 = vunpcklps_avx(auVar61,auVar57);
            auVar56 = vunpcklps_avx(auVar58,auVar59);
            auVar61 = vunpckhps_avx(auVar58,auVar59);
            auVar59 = vunpcklps_avx(auVar7,auVar3);
            auVar57 = vunpckhps_avx(auVar7,auVar3);
            auVar60 = vunpcklps_avx(auVar8,auVar102);
            auVar58 = vunpckhps_avx(auVar8,auVar102);
            auVar58 = vunpcklps_avx(auVar57,auVar58);
            auVar102 = vunpcklps_avx(auVar59,auVar60);
            auVar57 = vunpckhps_avx(auVar59,auVar60);
            auVar103._16_16_ = auVar3;
            auVar103._0_16_ = auVar7;
            auVar100._16_16_ = auVar9;
            auVar100._0_16_ = auVar6;
            auVar62 = vunpcklps_avx(auVar100,auVar103);
            auVar109._16_16_ = auVar4;
            auVar109._0_16_ = auVar8;
            auVar97._16_16_ = auVar8;
            auVar97._0_16_ = auVar5;
            auVar63 = vunpcklps_avx(auVar97,auVar109);
            auVar64 = vunpcklps_avx(auVar63,auVar62);
            auVar63 = vunpckhps_avx(auVar63,auVar62);
            auVar62 = vunpckhps_avx(auVar100,auVar103);
            auVar84 = vunpckhps_avx(auVar97,auVar109);
            auVar84 = vunpcklps_avx(auVar84,auVar62);
            auVar101._16_16_ = auVar56;
            auVar101._0_16_ = auVar56;
            auVar94._16_16_ = auVar61;
            auVar94._0_16_ = auVar61;
            auVar104._16_16_ = auVar26;
            auVar104._0_16_ = auVar26;
            auVar110._16_16_ = auVar102;
            auVar110._0_16_ = auVar102;
            auVar116._16_16_ = auVar57;
            auVar116._0_16_ = auVar57;
            uVar98 = *(undefined4 *)&(local_15c0->org).field_0;
            auVar120._4_4_ = uVar98;
            auVar120._0_4_ = uVar98;
            auVar120._8_4_ = uVar98;
            auVar120._12_4_ = uVar98;
            auVar120._16_4_ = uVar98;
            auVar120._20_4_ = uVar98;
            auVar120._24_4_ = uVar98;
            auVar120._28_4_ = uVar98;
            uVar98 = *(undefined4 *)((long)&(local_15c0->org).field_0 + 4);
            auVar122._4_4_ = uVar98;
            auVar122._0_4_ = uVar98;
            auVar122._8_4_ = uVar98;
            auVar122._12_4_ = uVar98;
            auVar122._16_4_ = uVar98;
            auVar122._20_4_ = uVar98;
            auVar122._24_4_ = uVar98;
            auVar122._28_4_ = uVar98;
            auVar66 = vbroadcastss_avx512vl(ZEXT416((uint)(local_15c0->org).field_0.m128[2]));
            uVar98 = *(undefined4 *)&(local_15c0->dir).field_0;
            auVar107._4_4_ = uVar98;
            auVar107._0_4_ = uVar98;
            auVar107._8_4_ = uVar98;
            auVar107._12_4_ = uVar98;
            auVar107._16_4_ = uVar98;
            auVar107._20_4_ = uVar98;
            auVar107._24_4_ = uVar98;
            auVar107._28_4_ = uVar98;
            auVar67 = vinsertf32x4_avx512vl(ZEXT1632(auVar58),auVar58,1);
            uVar98 = *(undefined4 *)((long)&(local_15c0->dir).field_0 + 4);
            auVar112._4_4_ = uVar98;
            auVar112._0_4_ = uVar98;
            auVar112._8_4_ = uVar98;
            auVar112._12_4_ = uVar98;
            auVar112._16_4_ = uVar98;
            auVar112._20_4_ = uVar98;
            auVar112._24_4_ = uVar98;
            auVar112._28_4_ = uVar98;
            fVar118 = (local_15c0->dir).field_0.m128[2];
            auVar114._4_4_ = fVar118;
            auVar114._0_4_ = fVar118;
            auVar114._8_4_ = fVar118;
            auVar114._12_4_ = fVar118;
            auVar114._16_4_ = fVar118;
            auVar114._20_4_ = fVar118;
            auVar114._24_4_ = fVar118;
            auVar114._28_4_ = fVar118;
            auVar62 = vsubps_avx(auVar64,auVar120);
            auVar63 = vsubps_avx(auVar63,auVar122);
            auVar68 = vsubps_avx512vl(auVar84,auVar66);
            auVar84 = vsubps_avx(auVar101,auVar120);
            auVar64 = vsubps_avx(auVar94,auVar122);
            auVar65 = vsubps_avx512vl(auVar104,auVar66);
            auVar69 = vsubps_avx512vl(auVar110,auVar120);
            auVar70 = vsubps_avx512vl(auVar116,auVar122);
            auVar66 = vsubps_avx512vl(auVar67,auVar66);
            auVar67 = vsubps_avx512vl(auVar69,auVar62);
            auVar71 = vsubps_avx512vl(auVar70,auVar63);
            auVar72 = vsubps_avx512vl(auVar66,auVar68);
            auVar73 = vsubps_avx512vl(auVar62,auVar84);
            auVar74 = vsubps_avx512vl(auVar63,auVar64);
            auVar75 = vsubps_avx512vl(auVar68,auVar65);
            auVar76 = vsubps_avx512vl(auVar84,auVar69);
            auVar77 = vsubps_avx512vl(auVar64,auVar70);
            auVar78 = vsubps_avx512vl(auVar65,auVar66);
            auVar79 = vaddps_avx512vl(auVar69,auVar62);
            auVar80 = vaddps_avx512vl(auVar70,auVar63);
            auVar81 = vaddps_avx512vl(auVar66,auVar68);
            auVar82 = vmulps_avx512vl(auVar80,auVar72);
            auVar82 = vfmsub231ps_avx512vl(auVar82,auVar71,auVar81);
            auVar81 = vmulps_avx512vl(auVar81,auVar67);
            auVar81 = vfmsub231ps_avx512vl(auVar81,auVar72,auVar79);
            auVar83._4_4_ = auVar79._4_4_ * auVar71._4_4_;
            auVar83._0_4_ = auVar79._0_4_ * auVar71._0_4_;
            auVar83._8_4_ = auVar79._8_4_ * auVar71._8_4_;
            auVar83._12_4_ = auVar79._12_4_ * auVar71._12_4_;
            auVar83._16_4_ = auVar79._16_4_ * auVar71._16_4_;
            auVar83._20_4_ = auVar79._20_4_ * auVar71._20_4_;
            auVar83._24_4_ = auVar79._24_4_ * auVar71._24_4_;
            auVar83._28_4_ = auVar79._28_4_;
            auVar61 = vfmsub231ps_fma(auVar83,auVar67,auVar80);
            auVar111._0_4_ = fVar118 * auVar61._0_4_;
            auVar111._4_4_ = fVar118 * auVar61._4_4_;
            auVar111._8_4_ = fVar118 * auVar61._8_4_;
            auVar111._12_4_ = fVar118 * auVar61._12_4_;
            auVar111._16_4_ = fVar118 * 0.0;
            auVar111._20_4_ = fVar118 * 0.0;
            auVar111._24_4_ = fVar118 * 0.0;
            auVar111._28_4_ = 0;
            auVar79 = vfmadd231ps_avx512vl(auVar111,auVar112,auVar81);
            auVar79 = vfmadd231ps_avx512vl(auVar79,auVar107,auVar82);
            auVar117._0_4_ = auVar62._0_4_ + auVar84._0_4_;
            auVar117._4_4_ = auVar62._4_4_ + auVar84._4_4_;
            auVar117._8_4_ = auVar62._8_4_ + auVar84._8_4_;
            auVar117._12_4_ = auVar62._12_4_ + auVar84._12_4_;
            auVar117._16_4_ = auVar62._16_4_ + auVar84._16_4_;
            auVar117._20_4_ = auVar62._20_4_ + auVar84._20_4_;
            auVar117._24_4_ = auVar62._24_4_ + auVar84._24_4_;
            auVar117._28_4_ = auVar62._28_4_ + auVar84._28_4_;
            auVar80 = vaddps_avx512vl(auVar63,auVar64);
            auVar81 = vaddps_avx512vl(auVar68,auVar65);
            auVar82 = vmulps_avx512vl(auVar80,auVar75);
            auVar82 = vfmsub231ps_avx512vl(auVar82,auVar74,auVar81);
            auVar81 = vmulps_avx512vl(auVar81,auVar73);
            auVar81 = vfmsub231ps_avx512vl(auVar81,auVar75,auVar117);
            auVar83 = vmulps_avx512vl(auVar117,auVar74);
            auVar80 = vfmsub231ps_avx512vl(auVar83,auVar73,auVar80);
            auVar36._4_4_ = fVar118 * auVar80._4_4_;
            auVar36._0_4_ = fVar118 * auVar80._0_4_;
            auVar36._8_4_ = fVar118 * auVar80._8_4_;
            auVar36._12_4_ = fVar118 * auVar80._12_4_;
            auVar36._16_4_ = fVar118 * auVar80._16_4_;
            auVar36._20_4_ = fVar118 * auVar80._20_4_;
            auVar36._24_4_ = fVar118 * auVar80._24_4_;
            auVar36._28_4_ = auVar80._28_4_;
            auVar80 = vfmadd231ps_avx512vl(auVar36,auVar112,auVar81);
            auVar80 = vfmadd231ps_avx512vl(auVar80,auVar107,auVar82);
            auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar84 = vaddps_avx512vl(auVar84,auVar69);
            auVar64 = vaddps_avx512vl(auVar64,auVar70);
            auVar66 = vaddps_avx512vl(auVar65,auVar66);
            auVar65 = vmulps_avx512vl(auVar64,auVar78);
            auVar65 = vfmsub231ps_avx512vl(auVar65,auVar77,auVar66);
            auVar66 = vmulps_avx512vl(auVar66,auVar76);
            auVar66 = vfmsub231ps_avx512vl(auVar66,auVar78,auVar84);
            auVar37._4_4_ = auVar84._4_4_ * auVar77._4_4_;
            auVar37._0_4_ = auVar84._0_4_ * auVar77._0_4_;
            auVar37._8_4_ = auVar84._8_4_ * auVar77._8_4_;
            auVar37._12_4_ = auVar84._12_4_ * auVar77._12_4_;
            auVar37._16_4_ = auVar84._16_4_ * auVar77._16_4_;
            auVar37._20_4_ = auVar84._20_4_ * auVar77._20_4_;
            auVar37._24_4_ = auVar84._24_4_ * auVar77._24_4_;
            auVar37._28_4_ = auVar84._28_4_;
            auVar61 = vfmsub231ps_fma(auVar37,auVar76,auVar64);
            auVar84 = vmulps_avx512vl(auVar114,ZEXT1632(auVar61));
            auVar84 = vfmadd231ps_avx512vl(auVar84,auVar112,auVar66);
            auVar84 = vfmadd231ps_avx512vl(auVar84,auVar107,auVar65);
            auVar95._0_4_ = auVar79._0_4_ + auVar80._0_4_;
            auVar95._4_4_ = auVar79._4_4_ + auVar80._4_4_;
            auVar95._8_4_ = auVar79._8_4_ + auVar80._8_4_;
            auVar95._12_4_ = auVar79._12_4_ + auVar80._12_4_;
            auVar95._16_4_ = auVar79._16_4_ + auVar80._16_4_;
            auVar95._20_4_ = auVar79._20_4_ + auVar80._20_4_;
            auVar95._24_4_ = auVar79._24_4_ + auVar80._24_4_;
            auVar95._28_4_ = auVar79._28_4_ + auVar80._28_4_;
            local_1300 = vaddps_avx512vl(auVar84,auVar95);
            vandps_avx512vl(local_1300,auVar83);
            auVar81._8_4_ = 0x34000000;
            auVar81._0_8_ = 0x3400000034000000;
            auVar81._12_4_ = 0x34000000;
            auVar81._16_4_ = 0x34000000;
            auVar81._20_4_ = 0x34000000;
            auVar81._24_4_ = 0x34000000;
            auVar81._28_4_ = 0x34000000;
            auVar64 = vmulps_avx512vl(local_1300,auVar81);
            auVar66 = vminps_avx512vl(auVar79,auVar80);
            auVar66 = vminps_avx512vl(auVar66,auVar84);
            auVar82._8_4_ = 0x80000000;
            auVar82._0_8_ = 0x8000000080000000;
            auVar82._12_4_ = 0x80000000;
            auVar82._16_4_ = 0x80000000;
            auVar82._20_4_ = 0x80000000;
            auVar82._24_4_ = 0x80000000;
            auVar82._28_4_ = 0x80000000;
            auVar65 = vxorps_avx512vl(auVar64,auVar82);
            uVar23 = vcmpps_avx512vl(auVar66,auVar65,5);
            auVar66 = vmaxps_avx512vl(auVar79,auVar80);
            auVar84 = vmaxps_avx512vl(auVar66,auVar84);
            uVar24 = vcmpps_avx512vl(auVar84,auVar64,2);
            local_12d8 = (byte)uVar23 | (byte)uVar24;
            if (local_12d8 != 0) {
              auVar84 = vmulps_avx512vl(auVar72,auVar74);
              auVar64 = vmulps_avx512vl(auVar67,auVar75);
              auVar66 = vmulps_avx512vl(auVar71,auVar73);
              auVar65 = vmulps_avx512vl(auVar75,auVar77);
              auVar69 = vmulps_avx512vl(auVar73,auVar78);
              auVar70 = vmulps_avx512vl(auVar74,auVar76);
              auVar71 = vfmsub213ps_avx512vl(auVar71,auVar75,auVar84);
              auVar72 = vfmsub213ps_avx512vl(auVar72,auVar73,auVar64);
              auVar67 = vfmsub213ps_avx512vl(auVar67,auVar74,auVar66);
              auVar74 = vfmsub213ps_avx512vl(auVar78,auVar74,auVar65);
              auVar75 = vfmsub213ps_avx512vl(auVar76,auVar75,auVar69);
              auVar73 = vfmsub213ps_avx512vl(auVar77,auVar73,auVar70);
              vandps_avx512vl(auVar84,auVar83);
              vandps_avx512vl(auVar65,auVar83);
              uVar45 = vcmpps_avx512vl(auVar73,auVar73,1);
              vandps_avx512vl(auVar64,auVar83);
              vandps_avx512vl(auVar69,auVar83);
              uVar47 = vcmpps_avx512vl(auVar73,auVar73,1);
              vandps_avx512vl(auVar66,auVar83);
              vandps_avx512vl(auVar70,auVar83);
              uVar53 = vcmpps_avx512vl(auVar73,auVar73,1);
              bVar16 = (bool)((byte)uVar45 & 1);
              auVar85._0_4_ = (float)((uint)bVar16 * auVar71._0_4_ | (uint)!bVar16 * auVar74._0_4_);
              bVar16 = (bool)((byte)(uVar45 >> 1) & 1);
              auVar85._4_4_ = (float)((uint)bVar16 * auVar71._4_4_ | (uint)!bVar16 * auVar74._4_4_);
              bVar16 = (bool)((byte)(uVar45 >> 2) & 1);
              auVar85._8_4_ = (float)((uint)bVar16 * auVar71._8_4_ | (uint)!bVar16 * auVar74._8_4_);
              bVar16 = (bool)((byte)(uVar45 >> 3) & 1);
              auVar85._12_4_ =
                   (float)((uint)bVar16 * auVar71._12_4_ | (uint)!bVar16 * auVar74._12_4_);
              bVar16 = (bool)((byte)(uVar45 >> 4) & 1);
              auVar85._16_4_ =
                   (float)((uint)bVar16 * auVar71._16_4_ | (uint)!bVar16 * auVar74._16_4_);
              bVar16 = (bool)((byte)(uVar45 >> 5) & 1);
              auVar85._20_4_ =
                   (float)((uint)bVar16 * auVar71._20_4_ | (uint)!bVar16 * auVar74._20_4_);
              bVar16 = (bool)((byte)(uVar45 >> 6) & 1);
              auVar85._24_4_ =
                   (float)((uint)bVar16 * auVar71._24_4_ | (uint)!bVar16 * auVar74._24_4_);
              bVar16 = SUB81(uVar45 >> 7,0);
              auVar85._28_4_ = (uint)bVar16 * auVar71._28_4_ | (uint)!bVar16 * auVar74._28_4_;
              bVar16 = (bool)((byte)uVar47 & 1);
              auVar86._0_4_ = (float)((uint)bVar16 * auVar72._0_4_ | (uint)!bVar16 * auVar75._0_4_);
              bVar16 = (bool)((byte)(uVar47 >> 1) & 1);
              auVar86._4_4_ = (float)((uint)bVar16 * auVar72._4_4_ | (uint)!bVar16 * auVar75._4_4_);
              bVar16 = (bool)((byte)(uVar47 >> 2) & 1);
              auVar86._8_4_ = (float)((uint)bVar16 * auVar72._8_4_ | (uint)!bVar16 * auVar75._8_4_);
              bVar16 = (bool)((byte)(uVar47 >> 3) & 1);
              auVar86._12_4_ =
                   (float)((uint)bVar16 * auVar72._12_4_ | (uint)!bVar16 * auVar75._12_4_);
              bVar16 = (bool)((byte)(uVar47 >> 4) & 1);
              auVar86._16_4_ =
                   (float)((uint)bVar16 * auVar72._16_4_ | (uint)!bVar16 * auVar75._16_4_);
              bVar16 = (bool)((byte)(uVar47 >> 5) & 1);
              auVar86._20_4_ =
                   (float)((uint)bVar16 * auVar72._20_4_ | (uint)!bVar16 * auVar75._20_4_);
              bVar16 = (bool)((byte)(uVar47 >> 6) & 1);
              auVar86._24_4_ =
                   (float)((uint)bVar16 * auVar72._24_4_ | (uint)!bVar16 * auVar75._24_4_);
              bVar16 = SUB81(uVar47 >> 7,0);
              auVar86._28_4_ = (uint)bVar16 * auVar72._28_4_ | (uint)!bVar16 * auVar75._28_4_;
              bVar16 = (bool)((byte)uVar53 & 1);
              fVar55 = (float)((uint)bVar16 * auVar67._0_4_ | (uint)!bVar16 * auVar73._0_4_);
              bVar16 = (bool)((byte)(uVar53 >> 1) & 1);
              fVar87 = (float)((uint)bVar16 * auVar67._4_4_ | (uint)!bVar16 * auVar73._4_4_);
              bVar16 = (bool)((byte)(uVar53 >> 2) & 1);
              fVar88 = (float)((uint)bVar16 * auVar67._8_4_ | (uint)!bVar16 * auVar73._8_4_);
              bVar16 = (bool)((byte)(uVar53 >> 3) & 1);
              fVar89 = (float)((uint)bVar16 * auVar67._12_4_ | (uint)!bVar16 * auVar73._12_4_);
              bVar16 = (bool)((byte)(uVar53 >> 4) & 1);
              fVar90 = (float)((uint)bVar16 * auVar67._16_4_ | (uint)!bVar16 * auVar73._16_4_);
              bVar16 = (bool)((byte)(uVar53 >> 5) & 1);
              fVar91 = (float)((uint)bVar16 * auVar67._20_4_ | (uint)!bVar16 * auVar73._20_4_);
              bVar16 = (bool)((byte)(uVar53 >> 6) & 1);
              fVar92 = (float)((uint)bVar16 * auVar67._24_4_ | (uint)!bVar16 * auVar73._24_4_);
              bVar16 = SUB81(uVar53 >> 7,0);
              auVar38._4_4_ = fVar118 * fVar87;
              auVar38._0_4_ = fVar118 * fVar55;
              auVar38._8_4_ = fVar118 * fVar88;
              auVar38._12_4_ = fVar118 * fVar89;
              auVar38._16_4_ = fVar118 * fVar90;
              auVar38._20_4_ = fVar118 * fVar91;
              auVar38._24_4_ = fVar118 * fVar92;
              auVar38._28_4_ = fVar118;
              auVar61 = vfmadd213ps_fma(auVar112,auVar86,auVar38);
              auVar61 = vfmadd213ps_fma(auVar107,auVar85,ZEXT1632(auVar61));
              auVar84 = ZEXT1632(CONCAT412(auVar61._12_4_ + auVar61._12_4_,
                                           CONCAT48(auVar61._8_4_ + auVar61._8_4_,
                                                    CONCAT44(auVar61._4_4_ + auVar61._4_4_,
                                                             auVar61._0_4_ + auVar61._0_4_))));
              auVar113._0_4_ = auVar68._0_4_ * fVar55;
              auVar113._4_4_ = auVar68._4_4_ * fVar87;
              auVar113._8_4_ = auVar68._8_4_ * fVar88;
              auVar113._12_4_ = auVar68._12_4_ * fVar89;
              auVar113._16_4_ = auVar68._16_4_ * fVar90;
              auVar113._20_4_ = auVar68._20_4_ * fVar91;
              auVar113._24_4_ = auVar68._24_4_ * fVar92;
              auVar113._28_4_ = 0;
              auVar61 = vfmadd213ps_fma(auVar63,auVar86,auVar113);
              auVar57 = vfmadd213ps_fma(auVar62,auVar85,ZEXT1632(auVar61));
              auVar62 = vrcp14ps_avx512vl(auVar84);
              auVar27._8_4_ = 0x3f800000;
              auVar27._0_8_ = 0x3f8000003f800000;
              auVar27._12_4_ = 0x3f800000;
              auVar27._16_4_ = 0x3f800000;
              auVar27._20_4_ = 0x3f800000;
              auVar27._24_4_ = 0x3f800000;
              auVar27._28_4_ = 0x3f800000;
              auVar63 = vfnmadd213ps_avx512vl(auVar62,auVar84,auVar27);
              auVar61 = vfmadd132ps_fma(auVar63,auVar62,auVar62);
              local_1280 = ZEXT1632(CONCAT412(auVar61._12_4_ * (auVar57._12_4_ + auVar57._12_4_),
                                              CONCAT48(auVar61._8_4_ *
                                                       (auVar57._8_4_ + auVar57._8_4_),
                                                       CONCAT44(auVar61._4_4_ *
                                                                (auVar57._4_4_ + auVar57._4_4_),
                                                                auVar61._0_4_ *
                                                                (auVar57._0_4_ + auVar57._0_4_)))));
              uVar98 = *(undefined4 *)((long)&(local_15c0->org).field_0 + 0xc);
              auVar28._4_4_ = uVar98;
              auVar28._0_4_ = uVar98;
              auVar28._8_4_ = uVar98;
              auVar28._12_4_ = uVar98;
              auVar28._16_4_ = uVar98;
              auVar28._20_4_ = uVar98;
              auVar28._24_4_ = uVar98;
              auVar28._28_4_ = uVar98;
              uVar23 = vcmpps_avx512vl(local_1280,auVar28,0xd);
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar29._16_4_ = 0x80000000;
              auVar29._20_4_ = 0x80000000;
              auVar29._24_4_ = 0x80000000;
              auVar29._28_4_ = 0x80000000;
              auVar62 = vxorps_avx512vl(auVar84,auVar29);
              fVar118 = local_15c0->tfar;
              auVar30._4_4_ = fVar118;
              auVar30._0_4_ = fVar118;
              auVar30._8_4_ = fVar118;
              auVar30._12_4_ = fVar118;
              auVar30._16_4_ = fVar118;
              auVar30._20_4_ = fVar118;
              auVar30._24_4_ = fVar118;
              auVar30._28_4_ = fVar118;
              uVar24 = vcmpps_avx512vl(local_1280,auVar30,2);
              uVar25 = vcmpps_avx512vl(auVar84,auVar62,4);
              local_12d8 = (byte)uVar23 & (byte)uVar24 & (byte)uVar25 & local_12d8;
              if (local_12d8 != 0) {
                auVar2._0_4_ = local_15c0->tfar;
                auVar2._4_4_ = local_15c0->mask;
                auVar2._8_4_ = local_15c0->id;
                auVar2._12_4_ = local_15c0->flags;
                uVar46 = vextractps_avx(auVar2,1);
                local_12e0 = &local_15d9;
                auVar62 = vsubps_avx(local_1300,auVar80);
                local_1340 = vblendps_avx(auVar79,auVar62,0xf0);
                auVar62 = vsubps_avx(local_1300,auVar79);
                local_1320 = vblendps_avx(auVar80,auVar62,0xf0);
                fVar118 = (float)DAT_01fbac00;
                fVar17 = DAT_01fbac00._4_4_;
                local_1260._4_4_ = auVar85._4_4_ * fVar17;
                local_1260._0_4_ = auVar85._0_4_ * fVar118;
                fVar18 = DAT_01fbac00._8_4_;
                local_1260._8_4_ = auVar85._8_4_ * fVar18;
                fVar19 = DAT_01fbac00._12_4_;
                local_1260._12_4_ = auVar85._12_4_ * fVar19;
                fVar20 = DAT_01fbac00._16_4_;
                local_1260._16_4_ = auVar85._16_4_ * fVar20;
                fVar21 = DAT_01fbac00._20_4_;
                local_1260._20_4_ = auVar85._20_4_ * fVar21;
                fVar22 = DAT_01fbac00._24_4_;
                local_1260._24_4_ = auVar85._24_4_ * fVar22;
                local_1260._28_4_ = auVar85._28_4_;
                local_1240[0] = auVar86._0_4_ * fVar118;
                local_1240[1] = auVar86._4_4_ * fVar17;
                local_1240[2] = auVar86._8_4_ * fVar18;
                local_1240[3] = auVar86._12_4_ * fVar19;
                fStack_1230 = auVar86._16_4_ * fVar20;
                fStack_122c = auVar86._20_4_ * fVar21;
                fStack_1228 = auVar86._24_4_ * fVar22;
                uStack_1224 = auVar86._28_4_;
                local_1220[0] = fVar55 * fVar118;
                local_1220[1] = fVar87 * fVar17;
                local_1220[2] = fVar88 * fVar18;
                local_1220[3] = fVar89 * fVar19;
                fStack_1210 = fVar90 * fVar20;
                fStack_120c = fVar91 * fVar21;
                fStack_1208 = fVar92 * fVar22;
                uStack_1204 = (uint)bVar16 * auVar67._28_4_ | (uint)!bVar16 * auVar73._28_4_;
                local_15d0 = (local_1520->geometries).items[local_1588].ptr;
                if ((local_15d0->mask & uVar46) != 0) {
                  local_15c8 = local_1598->args;
                  if ((local_15c8->filter == (RTCFilterFunctionN)0x0) &&
                     (local_15d0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01c84ec0:
                    local_15c0->tfar = -INFINITY;
                    return;
                  }
                  auVar62 = vpbroadcastd_avx512vl();
                  auVar62 = vpaddd_avx2(auVar62,_DAT_01fb7740);
                  auVar63 = vpbroadcastd_avx512vl();
                  auVar63 = vpaddd_avx2(auVar63,_DAT_01fb7760);
                  auVar105._0_4_ = (float)(int)(*(ushort *)(local_1528 + 8 + local_1530) - 1);
                  auVar105._4_12_ = auVar68._4_12_;
                  auVar41._12_4_ = 0;
                  auVar41._0_12_ = ZEXT812(0);
                  auVar57 = vrcp14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)auVar105._0_4_));
                  auVar61 = vfnmadd213ss_fma(auVar105,auVar57,SUB6416(ZEXT464(0x40000000),0));
                  auVar108._0_4_ = (float)(int)(*(ushort *)(local_1528 + 10 + local_1530) - 1);
                  auVar108._4_12_ = auVar79._4_12_;
                  fVar92 = auVar57._0_4_ * auVar61._0_4_;
                  auVar57 = vrcp14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)auVar108._0_4_));
                  auVar61 = vfnmadd213ss_fma(auVar108,auVar57,SUB6416(ZEXT464(0x40000000),0));
                  fVar17 = auVar61._0_4_ * auVar57._0_4_;
                  auVar62 = vcvtdq2ps_avx(auVar62);
                  auVar63 = vcvtdq2ps_avx(auVar63);
                  auVar31._8_4_ = 0x219392ef;
                  auVar31._0_8_ = 0x219392ef219392ef;
                  auVar31._12_4_ = 0x219392ef;
                  auVar31._16_4_ = 0x219392ef;
                  auVar31._20_4_ = 0x219392ef;
                  auVar31._24_4_ = 0x219392ef;
                  auVar31._28_4_ = 0x219392ef;
                  uVar45 = vcmpps_avx512vl(local_1300,auVar31,5);
                  auVar84 = vrcp14ps_avx512vl(local_1300);
                  auVar106._8_4_ = 0x3f800000;
                  auVar106._0_8_ = 0x3f8000003f800000;
                  auVar106._12_4_ = 0x3f800000;
                  auVar106._16_4_ = 0x3f800000;
                  auVar106._20_4_ = 0x3f800000;
                  auVar106._24_4_ = 0x3f800000;
                  auVar106._28_4_ = 0x3f800000;
                  auVar61 = vfnmadd213ps_fma(local_1300,auVar84,auVar106);
                  auVar64 = vfmadd132ps_avx512vl(ZEXT1632(auVar61),auVar84,auVar84);
                  fVar91 = (float)((uint)((byte)uVar45 & 1) * auVar64._0_4_);
                  fVar90 = (float)((uint)((byte)(uVar45 >> 1) & 1) * auVar64._4_4_);
                  fVar89 = (float)((uint)((byte)(uVar45 >> 2) & 1) * auVar64._8_4_);
                  fVar88 = (float)((uint)((byte)(uVar45 >> 3) & 1) * auVar64._12_4_);
                  fVar87 = (float)((uint)((byte)(uVar45 >> 4) & 1) * auVar64._16_4_);
                  fVar55 = (float)((uint)((byte)(uVar45 >> 5) & 1) * auVar64._20_4_);
                  fVar118 = (float)((uint)((byte)(uVar45 >> 6) & 1) * auVar64._24_4_);
                  auVar39._4_4_ =
                       (local_1300._4_4_ * auVar62._4_4_ + local_1340._4_4_) * fVar92 * fVar90;
                  auVar39._0_4_ =
                       (local_1300._0_4_ * auVar62._0_4_ + local_1340._0_4_) * fVar92 * fVar91;
                  auVar39._8_4_ =
                       (local_1300._8_4_ * auVar62._8_4_ + local_1340._8_4_) * fVar92 * fVar89;
                  auVar39._12_4_ =
                       (local_1300._12_4_ * auVar62._12_4_ + local_1340._12_4_) * fVar92 * fVar88;
                  auVar39._16_4_ =
                       (local_1300._16_4_ * auVar62._16_4_ + local_1340._16_4_) * fVar92 * fVar87;
                  auVar39._20_4_ =
                       (local_1300._20_4_ * auVar62._20_4_ + local_1340._20_4_) * fVar92 * fVar55;
                  auVar39._24_4_ =
                       (local_1300._24_4_ * auVar62._24_4_ + local_1340._24_4_) * fVar92 * fVar118;
                  auVar39._28_4_ = auVar84._28_4_;
                  local_12c0 = vminps_avx(auVar39,auVar106);
                  auVar40._4_4_ =
                       (local_1300._4_4_ * auVar63._4_4_ + local_1320._4_4_) * fVar17 * fVar90;
                  auVar40._0_4_ =
                       (local_1300._0_4_ * auVar63._0_4_ + local_1320._0_4_) * fVar17 * fVar91;
                  auVar40._8_4_ =
                       (local_1300._8_4_ * auVar63._8_4_ + local_1320._8_4_) * fVar17 * fVar89;
                  auVar40._12_4_ =
                       (local_1300._12_4_ * auVar63._12_4_ + local_1320._12_4_) * fVar17 * fVar88;
                  auVar40._16_4_ =
                       (local_1300._16_4_ * auVar63._16_4_ + local_1320._16_4_) * fVar17 * fVar87;
                  auVar40._20_4_ =
                       (local_1300._20_4_ * auVar63._20_4_ + local_1320._20_4_) * fVar17 * fVar55;
                  auVar40._24_4_ =
                       (local_1300._24_4_ * auVar63._24_4_ + local_1320._24_4_) * fVar17 * fVar118;
                  auVar40._28_4_ = (uint)(byte)(uVar45 >> 7) * auVar64._28_4_;
                  local_12a0 = vminps_avx(auVar40,auVar106);
                  local_15b8 = 0;
                  local_15b0 = (ulong)local_12d8;
                  for (uVar45 = local_15b0; (uVar45 & 1) == 0;
                      uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                    local_15b8 = local_15b8 + 1;
                  }
                  local_15d8 = local_1598->user;
                  local_1420 = auVar126._0_32_;
                  local_1440 = auVar127._0_32_;
                  local_1460 = auVar128._0_32_;
                  local_1480 = auVar129._0_32_;
                  local_14a0 = auVar130._0_32_;
                  local_1580 = auVar2;
                  while (auVar61 = auVar125._0_16_, local_15b0 != 0) {
                    local_14f4 = *(undefined4 *)(local_12c0 + local_15b8 * 4);
                    local_14f0 = *(undefined4 *)(local_12a0 + local_15b8 * 4);
                    local_15c0->tfar = *(float *)(local_1280 + local_15b8 * 4);
                    local_1500 = local_1240[local_15b8 - 8];
                    local_14fc = local_1240[local_15b8];
                    local_14f8 = local_1220[local_15b8];
                    local_14ec = (undefined4)local_1550;
                    local_14e8 = (undefined4)local_1588;
                    local_14e4 = local_15d8->instID[0];
                    local_14e0 = local_15d8->instPrimID[0];
                    local_159c = -1;
                    local_14d0.valid = &local_159c;
                    local_14d0.geometryUserPtr = local_15d0->userPtr;
                    local_14d0.context = local_15d8;
                    local_14d0.ray = (RTCRayN *)local_15c0;
                    local_14d0.hit = (RTCHitN *)&local_1500;
                    local_14d0.N = 1;
                    if (((local_15d0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_15d0->occlusionFilterN)(&local_14d0), *local_14d0.valid != 0)) &&
                       ((local_15c8->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_15c8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_15d0->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*local_15c8->filter)(&local_14d0), *local_14d0.valid != 0))))))
                    goto LAB_01c84ec0;
                    local_15c0->tfar = (float)local_1580._0_4_;
                    uVar45 = local_15b8 & 0x3f;
                    local_15b8 = 0;
                    local_15b0 = local_15b0 ^ 1L << uVar45;
                    for (uVar45 = local_15b0; (uVar45 & 1) == 0;
                        uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                      local_15b8 = local_15b8 + 1;
                    }
                    auVar61 = vxorps_avx512vl(auVar61,auVar61);
                    auVar125 = ZEXT1664(auVar61);
                    auVar126 = ZEXT3264(local_1420);
                    auVar127 = ZEXT3264(local_1440);
                    auVar128 = ZEXT3264(local_1460);
                    auVar129 = ZEXT3264(local_1480);
                    auVar130 = ZEXT3264(local_14a0);
                  }
                }
              }
            }
            auVar115 = ZEXT3264(local_1360);
            auVar119 = ZEXT3264(local_13a0);
            auVar121 = ZEXT3264(local_13c0);
            auVar123 = ZEXT3264(local_13e0);
            auVar124 = ZEXT3264(local_1400);
            context = local_1598;
            ray = local_15c0;
            puVar51 = local_1590;
            lVar52 = local_1558;
            lVar54 = local_1560;
            fVar91 = local_1380;
            fVar118 = fStack_137c;
            fVar55 = fStack_1378;
            fVar87 = fStack_1374;
            fVar88 = fStack_1370;
            fVar89 = fStack_136c;
            fVar90 = fStack_1368;
            uVar45 = local_1538 - 1 & local_1538;
          }
        }
        goto LAB_01c84046;
      }
    }
  }
  return;
LAB_01c84194:
  do {
    *puVar51 = uVar45;
    puVar51 = puVar51 + 1;
    lVar43 = 0;
    for (uVar45 = uVar47; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
      lVar43 = lVar43 + 1;
    }
    uVar47 = uVar47 - 1 & uVar47;
    uVar45 = *(ulong *)(uVar42 + lVar43 * 8);
  } while (uVar47 != 0);
  goto LAB_01c84057;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }